

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawList::_OnChangedTextureID(ImDrawList *this)

{
  ImVec4 IVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ImTextureID pvVar5;
  ImDrawCmd *pIVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ImDrawCmd *__dest;
  int iVar9;
  int iVar10;
  undefined1 in_ZMM1 [64];
  
  pIVar6 = (this->CmdBuffer).Data;
  iVar10 = (this->CmdBuffer).Size;
  if ((pIVar6[(long)iVar10 + -1].ElemCount != 0) &&
     (pIVar6[(long)iVar10 + -1].TextureId != (this->_CmdHeader).TextureId)) {
    IVar1 = (this->_CmdHeader).ClipRect;
    auVar7 = vunpckhpd_avx((undefined1  [16])IVar1,ZEXT816(0) << 0x40);
    auVar7 = vcmpps_avx((undefined1  [16])IVar1,auVar7,2);
    auVar8 = vshufps_avx(auVar7,auVar7,0x50);
    auVar7 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
    if (((auVar7 & ~auVar8) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        -1 < SUB161(auVar7 & ~auVar8,0xf)) {
      pvVar5 = (this->_CmdHeader).TextureId;
      uVar2 = (this->_CmdHeader).VtxOffset;
      uVar3 = (this->IdxBuffer).Size;
      iVar10 = (this->CmdBuffer).Size;
      iVar4 = (this->CmdBuffer).Capacity;
      if (iVar10 == iVar4) {
        iVar10 = iVar10 + 1;
        if (iVar4 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar4 / 2 + iVar4;
        }
        if (iVar10 < iVar9) {
          iVar10 = iVar9;
        }
        if (iVar4 < iVar10) {
          __dest = (ImDrawCmd *)ImGui::MemAlloc((long)iVar10 * 0x38);
          pIVar6 = (this->CmdBuffer).Data;
          if (pIVar6 != (ImDrawCmd *)0x0) {
            memcpy(__dest,pIVar6,(long)(this->CmdBuffer).Size * 0x38);
            ImGui::MemFree((this->CmdBuffer).Data);
          }
          (this->CmdBuffer).Data = __dest;
          (this->CmdBuffer).Capacity = iVar10;
        }
      }
      pIVar6 = (this->CmdBuffer).Data;
      iVar10 = (this->CmdBuffer).Size;
      pIVar6[iVar10].ClipRect = IVar1;
      pIVar6[iVar10].TextureId = pvVar5;
      pIVar6[iVar10].VtxOffset = uVar2;
      pIVar6[iVar10].IdxOffset = uVar3;
      *(undefined8 *)&pIVar6[iVar10].ElemCount = 0;
      *(ImDrawCallback *)(&pIVar6[iVar10].ElemCount + 2) = (ImDrawCallback)0x0;
      pIVar6[iVar10].UserCallbackData = (void *)0x0;
      (this->CmdBuffer).Size = (this->CmdBuffer).Size + 1;
      return;
    }
    __assert_fail("draw_cmd.ClipRect.x <= draw_cmd.ClipRect.z && draw_cmd.ClipRect.y <= draw_cmd.ClipRect.w"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x1c1,"void ImDrawList::AddDrawCmd()");
  }
  if (pIVar6[(long)iVar10 + -1].UserCallback != (ImDrawCallback)0x0) {
    __assert_fail("curr_cmd->UserCallback == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x205,"void ImDrawList::_OnChangedTextureID()");
  }
  if ((((1 < iVar10) && (pIVar6[(long)iVar10 + -1].ElemCount == 0)) &&
      (auVar7 = vpor_avx((undefined1  [16])(this->_CmdHeader).ClipRect ^
                         (undefined1  [16])pIVar6[(long)iVar10 + -2].ClipRect,
                         *(undefined1 (*) [16])&(this->_CmdHeader).ClipRect.w ^
                         *(undefined1 (*) [16])&pIVar6[(long)iVar10 + -2].ClipRect.w),
      auVar7 == (undefined1  [16])0x0)) &&
     (pIVar6[(long)iVar10 + -2].UserCallback == (ImDrawCallback)0x0)) {
    (this->CmdBuffer).Size = iVar10 + -1;
    return;
  }
  pIVar6[(long)iVar10 + -1].TextureId = (this->_CmdHeader).TextureId;
  return;
}

Assistant:

void ImDrawList::_OnChangedTextureID()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != _CmdHeader.TextureId)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->TextureId = _CmdHeader.TextureId;
}